

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256_32.c
# Opt level: O3

uint64_t exp_check(uint64_t *n,uint64_t *a,uint32_t bBits,uint64_t *b)

{
  ulong *puVar1;
  uint64_t uVar2;
  uint uVar3;
  void *pvVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint uVar7;
  undefined4 in_register_00000014;
  uint32_t i;
  long lVar8;
  uint64_t *puVar9;
  uint32_t i_1;
  ulong uVar10;
  ulong uVar11;
  uint32_t i_2;
  void *__s;
  undefined8 uStack_280;
  uint64_t local_278 [65];
  uint64_t *local_70;
  ulong local_68;
  uint64_t local_60;
  ulong local_58;
  undefined1 *local_50;
  uint64_t *local_48;
  uint64_t *local_40;
  void *local_38;
  
  local_38 = (void *)CONCAT44(in_register_00000014,bBits);
  lVar8 = 0;
  uStack_280 = 0x190476;
  local_70 = a;
  local_40 = b;
  memset(local_278,0,0x200);
  local_278[0] = 1;
  local_60 = *n;
  local_58 = 0;
  local_48 = n;
  do {
    uVar6 = local_278[lVar8];
    uVar2 = local_48[lVar8];
    uStack_280 = 0x1904a5;
    uVar5 = FStar_UInt64_eq_mask(uVar6,uVar2);
    uStack_280 = 0x1904b3;
    uVar6 = FStar_UInt64_gte_mask(uVar6,uVar2);
    pvVar4 = local_38;
    local_58 = ~(uVar6 | uVar5) | local_58 & uVar5;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x40);
  uVar3 = (uint)local_38;
  uVar7 = 1;
  if (uVar3 != 0) {
    uVar7 = (uVar3 - 1 >> 6) + 1;
  }
  uVar11 = 0xffffffffffffffff;
  puVar9 = local_278;
  if (uVar3 < uVar7 << 6) {
    local_68 = (ulong)uVar7;
    lVar8 = -(ulong)(uVar7 * 8 + 0xf & 0xfffffff0);
    __s = (void *)((long)local_278 + lVar8);
    uVar10 = 0;
    local_50 = (undefined1 *)local_278;
    *(undefined8 *)((long)local_278 + lVar8 + -8) = 0x190528;
    memset(__s,0,(ulong)(uVar7 << 3));
    local_38 = __s;
    puVar1 = (ulong *)((long)__s + ((ulong)pvVar4 >> 6 & 0x3ffffff) * 8);
    *puVar1 = *puVar1 | 1L << ((byte)pvVar4 & 0x3f);
    uVar11 = 0;
    do {
      uVar6 = local_40[uVar10];
      uVar2 = *(uint64_t *)((long)local_38 + uVar10 * 8);
      *(undefined8 *)((long)local_278 + lVar8 + -8) = 0x19055d;
      uVar5 = FStar_UInt64_eq_mask(uVar6,uVar2);
      *(undefined8 *)((long)local_278 + lVar8 + -8) = 0x19056b;
      uVar6 = FStar_UInt64_gte_mask(uVar6,uVar2);
      uVar11 = ~(uVar6 | uVar5) | uVar11 & uVar5;
      uVar10 = uVar10 + 1;
      puVar9 = (uint64_t *)local_50;
    } while (local_68 != uVar10);
  }
  lVar8 = 0;
  uVar10 = 0;
  local_40 = (uint64_t *)uVar11;
  do {
    uVar6 = local_70[lVar8];
    uVar2 = local_48[lVar8];
    *(undefined8 *)((long)puVar9 + -8) = 0x1905af;
    uVar5 = FStar_UInt64_eq_mask(uVar6,uVar2);
    *(undefined8 *)((long)puVar9 + -8) = 0x1905bd;
    uVar6 = FStar_UInt64_gte_mask(uVar6,uVar2);
    uVar10 = ~(uVar6 | uVar5) | uVar10 & uVar5;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x40);
  return (ulong)local_40 & local_58 & -(ulong)((uint)local_60 & 1) & uVar10;
}

Assistant:

static uint32_t exp_check(uint32_t *n, uint32_t *a, uint32_t bBits, uint32_t *b)
{
  uint32_t one[8U] = { 0U };
  memset(one, 0U, 8U * sizeof (uint32_t));
  one[0U] = 1U;
  uint32_t bit0 = n[0U] & 1U;
  uint32_t m0 = 0U - bit0;
  uint32_t acc0 = 0U;
  KRML_MAYBE_FOR8(i,
    0U,
    8U,
    1U,
    uint32_t beq = FStar_UInt32_eq_mask(one[i], n[i]);
    uint32_t blt = ~FStar_UInt32_gte_mask(one[i], n[i]);
    acc0 = (beq & acc0) | (~beq & ((blt & 0xFFFFFFFFU) | (~blt & 0U))););
  uint32_t m10 = acc0;
  uint32_t m00 = m0 & m10;
  uint32_t bLen;
  if (bBits == 0U)
  {
    bLen = 1U;
  }
  else
  {
    bLen = (bBits - 1U) / 32U + 1U;
  }
  uint32_t m1;
  if (bBits < 32U * bLen)
  {
    KRML_CHECK_SIZE(sizeof (uint32_t), bLen);
    uint32_t b2[bLen];
    memset(b2, 0U, bLen * sizeof (uint32_t));
    uint32_t i0 = bBits / 32U;
    uint32_t j = bBits % 32U;
    b2[i0] = b2[i0] | 1U << j;
    uint32_t acc = 0U;
    for (uint32_t i = 0U; i < bLen; i++)
    {
      uint32_t beq = FStar_UInt32_eq_mask(b[i], b2[i]);
      uint32_t blt = ~FStar_UInt32_gte_mask(b[i], b2[i]);
      acc = (beq & acc) | (~beq & ((blt & 0xFFFFFFFFU) | (~blt & 0U)));
    }
    uint32_t res = acc;
    m1 = res;
  }
  else
  {
    m1 = 0xFFFFFFFFU;
  }
  uint32_t acc = 0U;
  KRML_MAYBE_FOR8(i,
    0U,
    8U,
    1U,
    uint32_t beq = FStar_UInt32_eq_mask(a[i], n[i]);
    uint32_t blt = ~FStar_UInt32_gte_mask(a[i], n[i]);
    acc = (beq & acc) | (~beq & ((blt & 0xFFFFFFFFU) | (~blt & 0U))););
  uint32_t m2 = acc;
  uint32_t m = m1 & m2;
  return m00 & m;
}